

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Abc_Cex_t * Vga_ManDeriveCex(Vta_Man_t *p)

{
  int iVar1;
  int iVar2;
  sat_solver2 *s;
  int iVar3;
  int iVar4;
  Abc_Cex_t *pAVar5;
  Vta_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int iVar6;
  
  iVar6 = p->pGia->nRegs;
  pAVar5 = Abc_CexAlloc(iVar6,p->pGia->vCis->nSize - iVar6,p->pPars->iFrame + 1);
  pAVar5->iPo = 0;
  pAVar5->iFrame = p->pPars->iFrame;
  iVar6 = 1;
  while( true ) {
    if (p->nObjs <= iVar6) {
      return pAVar5;
    }
    pObj = Vta_ManObj(p,iVar6);
    if (pObj == (Vta_Obj_t *)0x0) break;
    pObj_00 = Gia_ManObj(p->pGia,pObj->iObj);
    if (pObj_00 == (Gia_Obj_t *)0x0) {
      return pAVar5;
    }
    iVar3 = Gia_ObjIsPi(p->pGia,pObj_00);
    if (iVar3 != 0) {
      s = p->pSat;
      iVar3 = Vta_ObjId(p,pObj);
      iVar3 = sat_solver2_var_value(s,iVar3);
      if (iVar3 != 0) {
        iVar3 = pAVar5->nPis;
        iVar1 = pObj->iFrame;
        iVar2 = pAVar5->nRegs;
        iVar4 = Gia_ObjCioId(pObj_00);
        iVar4 = iVar4 + iVar3 * iVar1 + iVar2;
        (&pAVar5[1].iPo)[iVar4 >> 5] = (&pAVar5[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
      }
    }
    iVar6 = iVar6 + 1;
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Vga_ManDeriveCex( Vta_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    int i;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Vta_ManForEachObjObj( p, pThis, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) && sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + pThis->iFrame * pCex->nPis + Gia_ObjCioId(pObj) );
    return pCex;
}